

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btBox2dShape.h
# Opt level: O3

void __thiscall
btBox2dShape::getPlane(btBox2dShape *this,btVector3 *planeNormal,btVector3 *planeSupport,int i)

{
  btScalar extraout_XMM0_Da;
  btScalar extraout_XMM0_Db;
  btScalar bVar1;
  btScalar bVar2;
  btVector4 plane;
  undefined8 local_30;
  btScalar local_28;
  
  (*(this->super_btPolyhedralConvexShape).super_btConvexInternalShape.super_btConvexShape.
    super_btCollisionShape._vptr_btCollisionShape[0x1f])(this,&local_30,(ulong)(uint)i);
  *(undefined8 *)planeNormal->m_floats = local_30;
  planeNormal->m_floats[2] = local_28;
  planeNormal->m_floats[3] = 0.0;
  bVar1 = -(btScalar)local_30;
  bVar2 = -(btScalar)((ulong)local_30 >> 0x20);
  (*(this->super_btPolyhedralConvexShape).super_btConvexInternalShape.super_btConvexShape.
    super_btCollisionShape._vptr_btCollisionShape[0x10])(this);
  planeSupport->m_floats[0] = extraout_XMM0_Da;
  planeSupport->m_floats[1] = extraout_XMM0_Db;
  planeSupport->m_floats[2] = bVar1;
  planeSupport->m_floats[3] = bVar2;
  return;
}

Assistant:

virtual void getPlane(btVector3& planeNormal,btVector3& planeSupport,int i ) const
	{
		//this plane might not be aligned...
		btVector4 plane ;
		getPlaneEquation(plane,i);
		planeNormal = btVector3(plane.getX(),plane.getY(),plane.getZ());
		planeSupport = localGetSupportingVertex(-planeNormal);
	}